

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

void ctype_prepqual(CTRepr *ctr,CTInfo info)

{
  CTInfo info_local;
  CTRepr *ctr_local;
  
  if ((info & 0x1000000) != 0) {
    ctype_prepstr(ctr,"volatile",8);
  }
  if ((info & 0x2000000) != 0) {
    ctype_prepstr(ctr,"const",5);
  }
  return;
}

Assistant:

static void ctype_prepqual(CTRepr *ctr, CTInfo info)
{
  if ((info & CTF_VOLATILE)) ctype_preplit(ctr, "volatile");
  if ((info & CTF_CONST)) ctype_preplit(ctr, "const");
}